

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O2

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSize
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  byte bVar1;
  ValueLength VVar2;
  unsigned_long uVar3;
  Exception *this_00;
  char *msg;
  ulong uVar4;
  
  if ((ulong)"\x01\x01"[*start] != 0) {
    return (ulong)"\x01\x01"[*start];
  }
  bVar1 = *start;
  uVar4 = (ulong)bVar1;
  if (0xe < SliceStaticData::TypeMap[uVar4] - 4) {
switchD_00108ddc_caseD_6:
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Invalid type for byteSize()";
    goto LAB_00108f2c;
  }
  switch((uint)SliceStaticData::TypeMap[uVar4]) {
  case 4:
  case 5:
    if ((byte)(bVar1 - 0x13) < 2) {
      VVar2 = readVariableValueLength<false>(start + 1);
      return VVar2;
    }
    if (bVar1 < 0x20) {
      uVar3 = readIntegerNonEmpty<unsigned_long>(start + 1,(ulong)SliceStaticData::WidthMap[uVar4]);
      return uVar3;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "invalid Array/Object type";
    goto LAB_00108f2c;
  default:
    goto switchD_00108ddc_caseD_6;
  case 0xe:
    if (bVar1 < 0xbf) {
      return uVar4 - 0x40;
    }
switchD_00108e3b_caseD_fd:
    VVar2 = *(long *)(start + 1) + 9;
    break;
  case 0xf:
    uVar3 = readIntegerNonEmpty<unsigned_long>(start + 1,uVar4 - 0xbf);
    VVar2 = (uVar3 + uVar4) - 0xbe;
    break;
  case 0x10:
    if (bVar1 < 0xd0) {
      uVar3 = readIntegerNonEmpty<unsigned_long>(start + 1,uVar4 - 199);
      VVar2 = (uVar3 + uVar4) - 0xc6;
    }
    else {
      uVar3 = readIntegerNonEmpty<unsigned_long>(start + 1,(ulong)(bVar1 - 0xcf));
      VVar2 = uVar3 + (bVar1 - 0xce);
    }
    break;
  case 0x11:
    switch((uint)bVar1) {
    case 0xf4:
    case 0xf5:
    case 0xf6:
      VVar2 = (ulong)start[1] + 2;
      break;
    case 0xf7:
    case 0xf8:
    case 0xf9:
      VVar2 = (ulong)*(ushort *)(start + 1) + 3;
      break;
    case 0xfa:
    case 0xfb:
    case 0xfc:
      VVar2 = (ulong)*(uint *)(start + 1) + 5;
      break;
    case 0xfd:
    case 0xfe:
    case 0xff:
      goto switchD_00108e3b_caseD_fd;
    default:
      goto switchD_00108ddc_caseD_6;
    }
    break;
  case 0x12:
    bVar1 = tagsOffset(this,start);
    if (bVar1 != 0) {
      VVar2 = byteSize(this,start + bVar1);
      return VVar2 + bVar1;
    }
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    msg = "Invalid tag data in byteSize()";
LAB_00108f2c:
    Exception::Exception(this_00,InternalError,msg);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return VVar2;
}

Assistant:

ValueLength byteSize(uint8_t const* start) const {
    // check if the type has a fixed length first
    ValueLength l =
        static_cast<ValueLength>(SliceStaticData::FixedTypeLengths[*start]);
    if (l != 0) {
      // return fixed length
      return l;
    }
    return byteSizeDynamic(start);
  }